

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xenc.c
# Opt level: O3

int charset_from_xenc(char *name)

{
  byte bVar1;
  byte *pbVar2;
  __int32_t **pp_Var3;
  long lVar4;
  byte bVar5;
  byte bVar6;
  long lVar7;
  
  bVar1 = *name;
  lVar7 = 0;
  while( true ) {
    pbVar2 = (byte *)xencs[lVar7].name;
    bVar5 = *pbVar2;
    if (bVar1 == 0 && bVar5 == 0) break;
    pp_Var3 = __ctype_tolower_loc();
    lVar4 = 1;
    bVar6 = bVar1;
    while ((*pp_Var3)[bVar6] == (*pp_Var3)[bVar5]) {
      bVar6 = name[lVar4];
      bVar5 = pbVar2[lVar4];
      lVar4 = lVar4 + 1;
      if (bVar5 == 0 && bVar6 == 0) goto LAB_00115e65;
    }
    if (!(bool)(~(bVar6 == 0) & 1) && bVar5 == 0) break;
    lVar7 = lVar7 + 1;
    if (lVar7 == 0x22) {
      return 0;
    }
  }
LAB_00115e65:
  return xencs[lVar7].charset;
}

Assistant:

int charset_from_xenc(const char *name)
{
    int i;

    for (i = 0; i < (int)lenof(xencs); i++) {
        const char *p, *q;
        p = name;
        q = xencs[i].name;
        while (*p || *q) {
                if (tolower((unsigned char)*p) != tolower((unsigned char)*q))
                break;
            p++; q++;
        }
        if (!*p && !*q)
            return xencs[i].charset;
    }

    return CS_NONE;                    /* not found */
}